

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O3

newtRef NVMInterpretStr(char *s,newtErr *errP)

{
  newtRef nVar1;
  newtErr err;
  uint32_t numStree;
  nps_syntax_node_t *stree;
  newtErr local_18;
  uint32_t local_14;
  nps_syntax_node_t *local_10;
  
  local_18 = NPSParseStr(s,&local_10,&local_14);
  nVar1 = 0xfff2;
  if (local_18 == 0) {
    nVar1 = NVMInterpret2(local_10,local_14,&local_18);
  }
  if (errP != (newtErr *)0x0) {
    *errP = local_18;
  }
  return nVar1;
}

Assistant:

newtRef NVMInterpretStr(const char * s, newtErr * errP)
{
    nps_syntax_node_t *	stree;
    uint32_t	numStree;
    newtRefVar	result = kNewtRefUnbind;
    newtErr	err;

    err = NPSParseStr(s, &stree, &numStree);

    if (err == kNErrNone)
        result = NVMInterpret2(stree, numStree, &err);

    if (errP != NULL)
        *errP = err;

    return result;
}